

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.cpp
# Opt level: O2

string * duckdb::ExtensionHelper::AddExtensionInstallHintToErrorMsg
                   (string *__return_storage_ptr__,DatabaseInstance *db,string *base_error,
                   string *extension_name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string install_hint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  bVar1 = CanAutoloadExtension(extension_name);
  if (bVar1) {
    if ((db->config).options.autoload_known_extensions == false) {
      ::std::operator+(&local_80,"Please try installing and loading the ",extension_name);
      ::std::operator+(&local_60,&local_80," extension by running:\nINSTALL ");
      ::std::operator+(&local_100,&local_60,extension_name);
      ::std::operator+(&local_e0,&local_100,";\nLOAD ");
      ::std::operator+(&local_c0,&local_e0,extension_name);
      ::std::operator+(&local_a0,&local_c0,
                       ";\n\nAlternatively, consider enabling auto-install and auto-load by running:\nSET autoinstall_known_extensions=1;\nSET autoload_known_extensions=1;"
                      );
      goto LAB_0040b2ae;
    }
    if ((db->config).options.autoinstall_known_extensions != false) goto LAB_0040b303;
    ::std::operator+(&local_100,"Please try installing the ",extension_name);
    ::std::operator+(&local_e0,&local_100," extension by running:\nINSTALL ");
    ::std::operator+(&local_c0,&local_e0,extension_name);
    ::std::operator+(&local_a0,&local_c0,
                     ";\n\nAlternatively, consider enabling autoinstall by running:\nSET autoinstall_known_extensions=1;"
                    );
    ::std::__cxx11::string::operator=((string *)&local_40,(string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    this = &local_100;
  }
  else {
    ::std::operator+(&local_80,"Please try installing and loading the ",extension_name);
    ::std::operator+(&local_60,&local_80," extension:\nINSTALL ");
    ::std::operator+(&local_100,&local_60,extension_name);
    ::std::operator+(&local_e0,&local_100,";\nLOAD ");
    ::std::operator+(&local_c0,&local_e0,extension_name);
    ::std::operator+(&local_a0,&local_c0,";\n\n");
LAB_0040b2ae:
    ::std::__cxx11::string::operator=((string *)&local_40,(string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_60);
    this = &local_80;
  }
  ::std::__cxx11::string::~string((string *)this);
LAB_0040b303:
  if (local_40._M_string_length == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)base_error);
  }
  else {
    ::std::operator+(&local_a0,base_error,"\n\n");
    ::std::operator+(__return_storage_ptr__,&local_a0,&local_40);
    ::std::__cxx11::string::~string((string *)&local_a0);
  }
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string ExtensionHelper::AddExtensionInstallHintToErrorMsg(DatabaseInstance &db, const string &base_error,
                                                          const string &extension_name) {
	string install_hint;

	auto &config = db.config;

	if (!ExtensionHelper::CanAutoloadExtension(extension_name)) {
		install_hint = "Please try installing and loading the " + extension_name + " extension:\nINSTALL " +
		               extension_name + ";\nLOAD " + extension_name + ";\n\n";
	} else if (!config.options.autoload_known_extensions) {
		install_hint =
		    "Please try installing and loading the " + extension_name + " extension by running:\nINSTALL " +
		    extension_name + ";\nLOAD " + extension_name +
		    ";\n\nAlternatively, consider enabling auto-install "
		    "and auto-load by running:\nSET autoinstall_known_extensions=1;\nSET autoload_known_extensions=1;";
	} else if (!config.options.autoinstall_known_extensions) {
		install_hint =
		    "Please try installing the " + extension_name + " extension by running:\nINSTALL " + extension_name +
		    ";\n\nAlternatively, consider enabling autoinstall by running:\nSET autoinstall_known_extensions=1;";
	}

	if (!install_hint.empty()) {
		return base_error + "\n\n" + install_hint;
	}

	return base_error;
}